

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

_Bool Field_Grown(FIELD *field,int amount)

{
  int iVar1;
  int iVar2;
  char *__ptr;
  FORM *form_00;
  int iVar3;
  int iVar4;
  char *__ptr_00;
  char *__dest;
  WINDOW_conflict *pWVar5;
  bool bVar6;
  bool bVar7;
  int local_94;
  int local_84;
  int local_80;
  FIELD *local_78;
  FIELD *linked_field;
  WINDOW_conflict *new_window;
  char *new_bp;
  char *old_bp;
  int i;
  _Bool need_visual_update;
  FORM *form;
  int growth;
  char *newbuf;
  char *oldbuf;
  int old_drows;
  int old_dcols;
  int new_buflen;
  int old_buflen;
  _Bool single_line_field;
  _Bool result;
  int amount_local;
  FIELD *field_local;
  
  new_buflen._3_1_ = false;
  if ((field != (FIELD *)0x0) && ((field->status & 8) != 0)) {
    bVar6 = (int)field->rows + field->nrow == 1;
    iVar3 = field->drows * field->dcols;
    iVar1 = field->dcols;
    iVar2 = field->drows;
    __ptr = field->buf;
    form_00 = field->form;
    bVar7 = false;
    if ((form_00 != (FORM *)0x0) && (bVar7 = false, (form_00->status & 1) != 0)) {
      bVar7 = form_00->current == field;
    }
    if (bVar7) {
      Synchronize_Buffer(form_00);
    }
    if (bVar6) {
      local_80 = field->cols * amount;
      form._4_4_ = local_80;
      if (field->maxgrow != 0) {
        if (field->maxgrow - field->dcols <= local_80) {
          local_80 = field->maxgrow - field->dcols;
        }
        form._4_4_ = local_80;
      }
      field->dcols = form._4_4_ + field->dcols;
      if (field->dcols == field->maxgrow) {
        field->status = field->status & 0xfff7;
      }
    }
    else {
      local_84 = ((int)field->rows + field->nrow) * amount;
      form._4_4_ = local_84;
      if (field->maxgrow != 0) {
        if (field->maxgrow - field->drows <= local_84) {
          local_84 = field->maxgrow - field->drows;
        }
        form._4_4_ = local_84;
      }
      field->drows = form._4_4_ + field->drows;
      if (field->drows == field->maxgrow) {
        field->status = field->status & 0xfff7;
      }
    }
    iVar4 = field->drows * field->dcols;
    __ptr_00 = (char *)malloc((long)((field->drows * field->dcols + 1) * (field->nbuf + 1)));
    if (__ptr_00 == (char *)0x0) {
      field->dcols = iVar1;
      field->drows = iVar2;
      if (((bVar6) && (field->dcols != field->maxgrow)) ||
         ((!bVar6 && (field->drows != field->maxgrow)))) {
        field->status = field->status | 8;
      }
      return false;
    }
    field->buf = __ptr_00;
    for (old_bp._0_4_ = 0; (int)old_bp <= field->nbuf; old_bp._0_4_ = (int)old_bp + 1) {
      __dest = field->buf + (int)old_bp * (field->drows * field->dcols + 1);
      memcpy(__dest,__ptr + (int)old_bp * (iVar3 + 1),(long)iVar3);
      if (iVar3 < iVar4) {
        memset(__dest + iVar3,0x20,(long)(iVar4 - iVar3));
      }
      __dest[iVar4] = '\0';
    }
    if (bVar7) {
      pWVar5 = (WINDOW_conflict *)newpad(field->drows,field->dcols);
      if (pWVar5 == (WINDOW_conflict *)0x0) {
        field->dcols = iVar1;
        field->drows = iVar2;
        field->buf = __ptr;
        if (((bVar6) && (field->dcols != field->maxgrow)) ||
           ((!bVar6 && (field->drows != field->maxgrow)))) {
          field->status = field->status | 8;
        }
        free(__ptr_00);
        return false;
      }
      if (form_00 == (FORM *)0x0) {
        __assert_fail("form!=(FORM *)0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                      ,0x21a,"_Bool Field_Grown(FIELD *, int)");
      }
      delwin(form_00->w);
      form_00->w = pWVar5;
      wbkgdset(form_00->w,field->pad | field->back);
      wattrset(form_00->w,field->fore);
      werase(form_00->w);
      Buffer_To_Window(field,form_00->w);
      if (form_00->w == (WINDOW_conflict *)0x0) {
        local_94 = -1;
      }
      else {
        local_94 = form_00->w->_maxy + 1;
      }
      wtouchln(form_00->w,0,local_94);
      wmove(form_00->w,form_00->currow,form_00->curcol);
    }
    free(__ptr);
    if (field != field->link) {
      for (local_78 = field->link; local_78 != field; local_78 = local_78->link) {
        local_78->buf = field->buf;
        local_78->drows = field->drows;
        local_78->dcols = field->dcols;
      }
    }
    new_buflen._3_1_ = true;
  }
  return new_buflen._3_1_;
}

Assistant:

static bool Field_Grown(FIELD * field, int amount)
{
  bool result = FALSE;

  if (field && Growable(field))
    {
      bool single_line_field = Single_Line_Field(field);
      int old_buflen = Buffer_Length(field);
      int new_buflen;
      int old_dcols = field->dcols;
      int old_drows = field->drows;
      char *oldbuf  = field->buf;
      char *newbuf;

      int growth;
      FORM *form = field->form;
      bool need_visual_update = ((form != (FORM *)0)      &&
                                 (form->status & _POSTED) &&
                                 (form->current==field));
      
      if (need_visual_update)
        Synchronize_Buffer(form);
      
      if (single_line_field)
        {
          growth = field->cols * amount;
          if (field->maxgrow)
            growth = Minimum(field->maxgrow - field->dcols,growth);
          field->dcols += growth;
          if (field->dcols == field->maxgrow)
            field->status &= ~_MAY_GROW;
        }
      else
        {
          growth = (field->rows + field->nrow) * amount;
          if (field->maxgrow)
            growth = Minimum(field->maxgrow - field->drows,growth);
          field->drows += growth;
          if (field->drows == field->maxgrow)
            field->status &= ~_MAY_GROW;
        }
      /* drows, dcols changed, so we get really the new buffer length */
      new_buflen = Buffer_Length(field);
      newbuf=(char *)malloc((size_t)Total_Buffer_Size(field));
      if (!newbuf)
        { /* restore to previous state */
          field->dcols = old_dcols;
          field->drows = old_drows;
          if (( single_line_field && (field->dcols!=field->maxgrow)) ||
              (!single_line_field && (field->drows!=field->maxgrow)))
            field->status |= _MAY_GROW;
          return FALSE;
        }
      else
        { /* Copy all the buffers. This is the reason why we can't
             just use realloc().
             */
          int i;
          char *old_bp;
          char *new_bp;
          
          field->buf = newbuf;
          for(i=0;i<=field->nbuf;i++)
            {
              new_bp = Address_Of_Nth_Buffer(field,i);
              old_bp = oldbuf + i*(1+old_buflen);
              memcpy(new_bp,old_bp,(size_t)old_buflen);
              if (new_buflen > old_buflen)
                memset(new_bp + old_buflen,C_BLANK,
                       (size_t)(new_buflen - old_buflen));
              *(new_bp + new_buflen) = '\0';
            }

          if (need_visual_update)
            {         
              WINDOW *new_window = newpad(field->drows,field->dcols);
              if (!new_window)
                { /* restore old state */
                  field->dcols = old_dcols;
                  field->drows = old_drows;
                  field->buf   = oldbuf;
                  if (( single_line_field              && 
                        (field->dcols!=field->maxgrow)) ||
                      (!single_line_field              && 
                       (field->drows!=field->maxgrow)))
                    field->status |= _MAY_GROW;
                  free( newbuf );
                  return FALSE;
                }
              assert(form!=(FORM *)0);
              delwin(form->w);
              form->w = new_window;
              Set_Field_Window_Attributes(field,form->w);
              werase(form->w);
              Buffer_To_Window(field,form->w);
              untouchwin(form->w);
              wmove(form->w,form->currow,form->curcol);
            }

          free(oldbuf);
          /* reflect changes in linked fields */
          if (field != field->link)
            {
              FIELD *linked_field;
              for(linked_field = field->link;
                  linked_field!= field;
                  linked_field = linked_field->link)
                {
                  linked_field->buf   = field->buf;
                  linked_field->drows = field->drows;
                  linked_field->dcols = field->dcols;
                }
            }
          result = TRUE;
        }       
    }
  return(result);
}